

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::clearEkkDataStatus(HEkk *this)

{
  (this->status_).has_ar_matrix = false;
  (this->status_).has_dual_steepest_edge_weights = false;
  (this->status_).has_fresh_rebuild = false;
  (this->status_).has_dual_objective_value = false;
  (this->status_).has_primal_objective_value = false;
  return;
}

Assistant:

void HEkk::clearEkkDataStatus() {
  // Just clears the Ekk status values associated with Ekk-specific
  // data: doesn't clear "initialised_for_new_lp", "initialised_for_solve" or
  // NLA status
  HighsSimplexStatus& status = this->status_;
  status.has_ar_matrix = false;
  status.has_dual_steepest_edge_weights = false;
  status.has_fresh_rebuild = false;
  status.has_dual_objective_value = false;
  status.has_primal_objective_value = false;
}